

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

int anon_unknown.dwarf_128a7b::GetIntPow(int number,int power)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (-1 < power) {
    iVar1 = 1;
    if (power != 0) {
      do {
        uVar2 = power & 0xfffffffe;
        iVar3 = 1;
        if ((power & 1U) != 0) {
          iVar3 = number;
        }
        iVar1 = iVar1 * iVar3;
        number = number * number;
        power = (uint)power >> 1;
      } while (1 < uVar2);
    }
    return iVar1;
  }
  if (number != 1) {
    if (number == -1) {
      return -(power & 1U) | 1;
    }
    return 0;
  }
  return 1;
}

Assistant:

int GetIntPow(int number, int power)
	{
		if(power < 0)
			return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

		int result = 1;
		while(power)
		{
			if(power & 1)
			{
				result *= number;
				power--;
			}
			number *= number;
			power >>= 1;
		}
		return result;
	}